

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

void __thiscall
pybind11::enum_<anurbs::TrimTypes>::enum_<>(enum_<anurbs::TrimTypes> *this,handle *scope,char *name)

{
  PyObject *pPVar1;
  type local_41;
  cpp_function setstate;
  accessor<pybind11::detail::accessor_policies::str_attr> local_38;
  
  class_<anurbs::TrimTypes>::class_<>
            (&this->super_class_<anurbs::TrimTypes>,(handle)scope->m_ptr,name);
  pPVar1 = scope->m_ptr;
  (this->m_base).m_base.m_ptr =
       (this->super_class_<anurbs::TrimTypes>).super_generic_type.super_object.super_handle.m_ptr;
  (this->m_base).m_parent.m_ptr = pPVar1;
  detail::enum_base::init(&this->m_base,(EVP_PKEY_CTX *)0x0);
  detail::initimpl::
  factory<pybind11::enum_<anurbs::TrimTypes>::enum_<>(pybind11::handle_const&,char_const*)::{lambda(unsigned_int)#1},pybind11::detail::void_type(*)(),anurbs::TrimTypes(unsigned_int),pybind11::detail::void_type()>
  ::execute<pybind11::class_<anurbs::TrimTypes>>
            ((factory<pybind11::enum_<anurbs::TrimTypes>::enum_<>(pybind11::handle_const&,char_const*)::_lambda(unsigned_int)_1_,pybind11::detail::void_type(*)(),anurbs::TrimTypes(unsigned_int),pybind11::detail::void_type()>
              *)&local_38,&this->super_class_<anurbs::TrimTypes>);
  class_<anurbs::TrimTypes>::
  def<pybind11::enum_<anurbs::TrimTypes>::enum_<>(pybind11::handle_const&,char_const*)::_lambda(anurbs::TrimTypes)_1_>
            (&this->super_class_<anurbs::TrimTypes>,"__int__",(type *)&local_38);
  class_<anurbs::TrimTypes>::
  def<pybind11::enum_<anurbs::TrimTypes>::enum_<>(pybind11::handle_const&,char_const*)::_lambda(anurbs::TrimTypes)_2_>
            (&this->super_class_<anurbs::TrimTypes>,"__index__",(type *)&local_38);
  local_38._0_8_ =
       (this->super_class_<anurbs::TrimTypes>).super_generic_type.super_object.super_handle.m_ptr;
  cpp_function::
  cpp_function<pybind11::enum_<anurbs::TrimTypes>::enum_<>(pybind11::handle_const&,char_const*)::_lambda(anurbs::TrimTypes&,unsigned_int)_1_,pybind11::is_method,void>
            (&setstate,&local_41,(is_method *)&local_38);
  local_38.obj.m_ptr =
       (this->super_class_<anurbs::TrimTypes>).super_generic_type.super_object.super_handle.m_ptr;
  local_38.key = "__setstate__";
  local_38.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
  detail::accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_38,&setstate);
  pybind11::object::~object(&local_38.cache);
  pybind11::object::~object((object *)&setstate);
  return;
}

Assistant:

enum_(const handle &scope, const char *name, const Extra&... extra)
      : class_<Type>(scope, name, extra...), m_base(*this, scope) {
        constexpr bool is_arithmetic = detail::any_of<std::is_same<arithmetic, Extra>...>::value;
        constexpr bool is_convertible = std::is_convertible<Type, Scalar>::value;
        m_base.init(is_arithmetic, is_convertible);

        def(init([](Scalar i) { return static_cast<Type>(i); }));
        def("__int__", [](Type value) { return (Scalar) value; });
        #if PY_MAJOR_VERSION < 3
            def("__long__", [](Type value) { return (Scalar) value; });
        #endif
        #if PY_MAJOR_VERSION > 3 || (PY_MAJOR_VERSION == 3 && PY_MINOR_VERSION >= 8)
            def("__index__", [](Type value) { return (Scalar) value; });
        #endif

        cpp_function setstate(
            [](Type &value, Scalar arg) { value = static_cast<Type>(arg); },
            is_method(*this));
        attr("__setstate__") = setstate;
    }